

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

void __thiscall cfd::core::ByteData::ByteData(ByteData *this,uint8_t *buffer,uint32_t size)

{
  CfdException *this_00;
  undefined8 uVar1;
  uchar *__dest;
  ByteData *__n;
  CfdError error_code;
  allocator local_69;
  string local_68 [32];
  CfdSourceLocation local_48;
  uint32_t local_1c;
  uint8_t *puStack_18;
  uint32_t size_local;
  uint8_t *buffer_local;
  ByteData *this_local;
  
  this_00 = (CfdException *)(ulong)size;
  __n = this;
  local_1c = size;
  puStack_18 = buffer;
  buffer_local = (uint8_t *)this;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x3e4cc9);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,(size_type)__n,
             (allocator_type *)this);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x3e4ce5);
  if (puStack_18 == (uint8_t *)0x0) {
    if (local_1c != 0) {
      local_48.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_bytedata.cpp"
                   ,0x2f);
      error_code = (CfdError)((ulong)__n >> 0x20);
      local_48.filename = local_48.filename + 1;
      local_48.line = 0x46;
      local_48.funcname = "ByteData";
      logger::warn<>(&local_48,"buffer is null.");
      uVar1 = __cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_68,"buffer is null.",&local_69);
      CfdException::CfdException(this_00,error_code,(string *)this);
      __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  else if (local_1c != 0) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,(size_type)__n);
    __dest = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3e4e43);
    memcpy(__dest,puStack_18,(ulong)local_1c);
  }
  return;
}

Assistant:

ByteData::ByteData(const uint8_t* buffer, uint32_t size) : data_(size) {
  if (buffer == nullptr) {
    if (size == 0) {
      // create empty buffer
    } else {
      warn(CFD_LOG_SOURCE, "buffer is null.");
      throw CfdException(kCfdIllegalArgumentError, "buffer is null.");
    }
  } else if (size != 0) {
    data_.resize(size);
    memcpy(data_.data(), buffer, size);
  }
}